

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O3

uint32_t re2c::utf8::rune_to_bytes(uint32_t *str,rune c)

{
  uint uVar1;
  
  if (c < 0x80) {
    *str = c;
    return 1;
  }
  if (c < 0x800) {
    *str = c >> 6 | 0xc0;
    str[1] = c & 0x3f | 0x80;
    return 2;
  }
  uVar1 = 0xfffd;
  if (c < 0x110000) {
    uVar1 = c;
  }
  if (uVar1 < 0x10000) {
    *str = uVar1 >> 0xc | 0xe0;
    str[1] = uVar1 >> 6 & 0x3f | 0x80;
    str[2] = uVar1 & 0x3f | 0x80;
    return 3;
  }
  *str = uVar1 >> 0x12 | 0xf0;
  str[1] = uVar1 >> 0xc & 0x3f | 0x80;
  str[2] = uVar1 >> 6 & 0x3f | 0x80;
  str[3] = uVar1 & 0x3f | 0x80;
  return 4;
}

Assistant:

uint32_t utf8::rune_to_bytes(uint32_t *str, rune c)
{
	// one byte sequence: 0-0x7F => 0xxxxxxx
	if (c <= MAX_1BYTE_RUNE)
	{
		str[0] = PREFIX_1BYTE | c;
		return 1;
	}

	// two byte sequence: 0x80-0x7FF => 110xxxxx 10xxxxxx
	if (c <= MAX_2BYTE_RUNE)
	{
		str[0] = PREFIX_2BYTE | (c >> 1*SHIFT);
		str[1] = INFIX        | (c & MASK);
		return 2;
	}

	// If the Rune is out of range, convert it to the error rune.
	// Do this test here because the error rune encodes to three bytes.
	// Doing it earlier would duplicate work, since an out of range
	// Rune wouldn't have fit in one or two bytes.
	if (c > MAX_RUNE)
		c = ERROR;

	// three byte sequence: 0x800 - 0xFFFF => 1110xxxx 10xxxxxx 10xxxxxx
	if (c <= MAX_3BYTE_RUNE)
	{
		str[0] = PREFIX_3BYTE | (c >> 2*SHIFT);
		str[1] = INFIX        | ((c >> 1*SHIFT) & MASK);
		str[2] = INFIX        | (c & MASK);
		return 3;
	}

	// four byte sequence (21-bit value):
	// 0x10000 - 0x1FFFFF => 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
	str[0] = PREFIX_4BYTE | (c >> 3*SHIFT);
	str[1] = INFIX        | ((c >> 2*SHIFT) & MASK);
	str[2] = INFIX        | ((c >> 1*SHIFT) & MASK);
	str[3] = INFIX        | (c & MASK);
	return 4;
}